

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

void Omega_h::anon_unknown_41::promote(LO size,Int dim,any *lhs,any *rhs)

{
  char *pcVar1;
  int iVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  ScopedTimer local_29;
  
  begin_code("promote(size, dim, lhs, rhs)",(char *)0x0);
  ScopedTimer::~ScopedTimer(&local_29);
  if (dim == 1) {
    ptVar4 = (type_info *)&void::typeinfo;
    ptVar3 = (type_info *)&void::typeinfo;
    if (lhs->vtable != (vtable_type *)0x0) {
      ptVar3 = (*lhs->vtable->type)();
    }
    if (rhs->vtable != (vtable_type *)0x0) {
      ptVar4 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 == *(char **)(ptVar4 + 8)) {
      return;
    }
    if ((*pcVar1 != '*') && (iVar2 = strcmp(pcVar1,*(char **)(ptVar4 + 8)), iVar2 == 0)) {
      return;
    }
    promote_bools(size,lhs,rhs);
    promote_scalars(size,lhs,rhs);
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h6VectorILi1EEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6VectorILi1EEE"), iVar2 == 0)))) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*rhs->vtable->type)();
      }
      pcVar1 = *(char **)(ptVar3 + 8);
      if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
         ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
        promote_vector<1>(size,lhs);
      }
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*rhs->vtable->type)();
      }
      pcVar1 = *(char **)(ptVar3 + 8);
      if ((pcVar1 == "N7Omega_h6VectorILi1EEE") ||
         ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6VectorILi1EEE"), iVar2 == 0)))) {
        promote_vector<1>(size,rhs);
      }
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h6MatrixILi1ELi1EEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6MatrixILi1ELi1EEE"), iVar2 == 0)))) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*rhs->vtable->type)();
      }
      pcVar1 = *(char **)(ptVar3 + 8);
      if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
         ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
        promote_matrix<1>(size,lhs);
      }
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 != "N7Omega_h4ReadIdEE") {
      if (*pcVar1 == '*') {
        return;
      }
      iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE");
      if (iVar2 != 0) {
        return;
      }
    }
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 != "N7Omega_h6MatrixILi1ELi1EEE") {
      if (*pcVar1 == '*') {
        return;
      }
      iVar2 = strcmp(pcVar1,"N7Omega_h6MatrixILi1ELi1EEE");
      if (iVar2 != 0) {
        return;
      }
    }
    promote_matrix<1>(size,rhs);
    return;
  }
  if (dim != 2) {
    if (dim != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_expr.cpp"
           ,0x5e);
    }
    ptVar4 = (type_info *)&void::typeinfo;
    ptVar3 = (type_info *)&void::typeinfo;
    if (lhs->vtable != (vtable_type *)0x0) {
      ptVar3 = (*lhs->vtable->type)();
    }
    if (rhs->vtable != (vtable_type *)0x0) {
      ptVar4 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 == *(char **)(ptVar4 + 8)) {
      return;
    }
    if ((*pcVar1 != '*') && (iVar2 = strcmp(pcVar1,*(char **)(ptVar4 + 8)), iVar2 == 0)) {
      return;
    }
    promote_bools(size,lhs,rhs);
    promote_scalars(size,lhs,rhs);
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h6VectorILi3EEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6VectorILi3EEE"), iVar2 == 0)))) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*rhs->vtable->type)();
      }
      pcVar1 = *(char **)(ptVar3 + 8);
      if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
         ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
        promote_vector<3>(size,lhs);
      }
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*rhs->vtable->type)();
      }
      pcVar1 = *(char **)(ptVar3 + 8);
      if ((pcVar1 == "N7Omega_h6VectorILi3EEE") ||
         ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6VectorILi3EEE"), iVar2 == 0)))) {
        promote_vector<3>(size,rhs);
      }
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h6MatrixILi3ELi3EEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6MatrixILi3ELi3EEE"), iVar2 == 0)))) {
      if (rhs->vtable == (vtable_type *)0x0) {
        ptVar3 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar3 = (*rhs->vtable->type)();
      }
      pcVar1 = *(char **)(ptVar3 + 8);
      if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
         ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
        promote_matrix<3>(size,lhs);
      }
    }
    if (lhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*lhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 != "N7Omega_h4ReadIdEE") {
      if (*pcVar1 == '*') {
        return;
      }
      iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE");
      if (iVar2 != 0) {
        return;
      }
    }
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if (pcVar1 != "N7Omega_h6MatrixILi3ELi3EEE") {
      if (*pcVar1 == '*') {
        return;
      }
      iVar2 = strcmp(pcVar1,"N7Omega_h6MatrixILi3ELi3EEE");
      if (iVar2 != 0) {
        return;
      }
    }
    promote_matrix<3>(size,rhs);
    return;
  }
  ptVar4 = (type_info *)&void::typeinfo;
  ptVar3 = (type_info *)&void::typeinfo;
  if (lhs->vtable != (vtable_type *)0x0) {
    ptVar3 = (*lhs->vtable->type)();
  }
  if (rhs->vtable != (vtable_type *)0x0) {
    ptVar4 = (*rhs->vtable->type)();
  }
  pcVar1 = *(char **)(ptVar3 + 8);
  if (pcVar1 == *(char **)(ptVar4 + 8)) {
    return;
  }
  if ((*pcVar1 != '*') && (iVar2 = strcmp(pcVar1,*(char **)(ptVar4 + 8)), iVar2 == 0)) {
    return;
  }
  promote_bools(size,lhs,rhs);
  promote_scalars(size,lhs,rhs);
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  pcVar1 = *(char **)(ptVar3 + 8);
  if ((pcVar1 == "N7Omega_h6VectorILi2EEE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6VectorILi2EEE"), iVar2 == 0)))) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
      promote_vector<2>(size,lhs);
    }
  }
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  pcVar1 = *(char **)(ptVar3 + 8);
  if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h6VectorILi2EEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6VectorILi2EEE"), iVar2 == 0)))) {
      promote_vector<2>(size,rhs);
    }
  }
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  pcVar1 = *(char **)(ptVar3 + 8);
  if ((pcVar1 == "N7Omega_h6MatrixILi2ELi2EEE") ||
     ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h6MatrixILi2ELi2EEE"), iVar2 == 0)))) {
    if (rhs->vtable == (vtable_type *)0x0) {
      ptVar3 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar3 = (*rhs->vtable->type)();
    }
    pcVar1 = *(char **)(ptVar3 + 8);
    if ((pcVar1 == "N7Omega_h4ReadIdEE") ||
       ((*pcVar1 != '*' && (iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE"), iVar2 == 0)))) {
      promote_matrix<2>(size,lhs);
    }
  }
  if (lhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*lhs->vtable->type)();
  }
  pcVar1 = *(char **)(ptVar3 + 8);
  if (pcVar1 != "N7Omega_h4ReadIdEE") {
    if (*pcVar1 == '*') {
      return;
    }
    iVar2 = strcmp(pcVar1,"N7Omega_h4ReadIdEE");
    if (iVar2 != 0) {
      return;
    }
  }
  if (rhs->vtable == (vtable_type *)0x0) {
    ptVar3 = (type_info *)&void::typeinfo;
  }
  else {
    ptVar3 = (*rhs->vtable->type)();
  }
  pcVar1 = *(char **)(ptVar3 + 8);
  if (pcVar1 != "N7Omega_h6MatrixILi2ELi2EEE") {
    if (*pcVar1 == '*') {
      return;
    }
    iVar2 = strcmp(pcVar1,"N7Omega_h6MatrixILi2ELi2EEE");
    if (iVar2 != 0) {
      return;
    }
  }
  promote_matrix<2>(size,rhs);
  return;
}

Assistant:

void promote(LO size, Int dim, any& lhs, any& rhs) {
  ScopedTimer("promote(size, dim, lhs, rhs)");
  if (dim == 3)
    promote<3>(size, lhs, rhs);
  else if (dim == 2)
    promote<2>(size, lhs, rhs);
  else if (dim == 1)
    promote<1>(size, lhs, rhs);
  else {
    OMEGA_H_NORETURN();
  }
}